

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool ModulusSimpleCaseHelper<char,_signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::ModulusSimpleCase(char lhs,
                        SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        rhs,SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                            *result)

{
  bool bVar1;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *in_RDX;
  undefined1 in_SIL;
  undefined1 in_DIL;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffec;
  undefined1 in_stack_ffffffffffffffed;
  undefined5 in_stack_fffffffffffffff8;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar2 = in_SIL;
  bVar1 = ::operator!=((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )(char)((ulong)in_RDX >> 0x38),(int)in_RDX);
  if (bVar1) {
    bVar1 = ModulusSignedCaseHelper<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
            ::SignedCase((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )(char)((ulong)in_RDX >> 0x30),
                         (SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)CONCAT17(in_SIL,CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffffed,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffffec,
                                                  in_stack_ffffffffffffffe8)))));
    if (!bVar1) {
      ::SafeInt::operator_cast_to_char(in_RDX);
      SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
                (unaff_retaddr,
                 (char *)CONCAT17(in_stack_ffffffffffffffff,
                                  CONCAT16(uVar2,CONCAT15(in_DIL,in_stack_fffffffffffffff8))));
    }
    return true;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
}

Assistant:

static bool ModulusSimpleCase( U lhs, SafeInt< T, E > rhs, SafeInt< T, E >& result ) SAFEINT_CPP_THROW
    {
        if( rhs != 0 )
        {
            if( ModulusSignedCaseHelper< T, E, std::numeric_limits< T >::is_signed >::SignedCase( rhs, result ) )
            return true;

            result = (T)( lhs % (T)rhs );
            return true;
        }

        E::SafeIntOnDivZero();
    }